

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPDistScheduleClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPDistScheduleClause *this)

{
  bool bVar1;
  string local_98;
  string local_78;
  OpenMPDistScheduleClauseKind local_58;
  allocator<char> local_51;
  OpenMPDistScheduleClauseKind kind;
  string clause_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPDistScheduleClause *local_18;
  OpenMPDistScheduleClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPDistScheduleClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"dist_schedule ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&kind,"(",&local_51);
  std::allocator<char>::~allocator(&local_51);
  local_58 = getKind(this);
  if (local_58 == OMPC_DIST_SCHEDULE_KIND_static) {
    std::__cxx11::string::operator+=((string *)&kind,"static");
  }
  getChunkSize_abi_cxx11_(&local_78,this);
  bVar1 = std::operator!=(&local_78,"");
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)&kind,", ");
    getChunkSize_abi_cxx11_(&local_98,this);
    std::__cxx11::string::operator+=((string *)&kind,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::operator+=((string *)&kind,") ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&kind);
  local_19 = 1;
  std::__cxx11::string::~string((string *)&kind);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDistScheduleClause::toString() {

    std::string result = "dist_schedule ";
    std::string clause_string = "(";
    OpenMPDistScheduleClauseKind kind = this->getKind();
    switch (kind) {
        case OMPC_DIST_SCHEDULE_KIND_static:
            clause_string += "static";
            break;
        default:
            ;
    }
    if (this->getChunkSize() != "") {
        clause_string += ", ";
    clause_string += this->getChunkSize();}
    clause_string += ") ";
    result += clause_string;
    return result;
}